

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

void __thiscall
FIX::Session::generateBusinessReject(Session *this,Message *message,int err,int field)

{
  SessionState *this_00;
  pointer pcVar1;
  pointer pcVar2;
  string *psVar3;
  pointer pcVar4;
  bool bVar5;
  FieldBase *this_01;
  FieldBase *pFVar6;
  uint64_t data;
  long *plVar7;
  undefined8 *puVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong *puVar10;
  string *psVar11;
  undefined8 uVar12;
  Session *this_02;
  char *__s;
  Message reject;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  int local_26c;
  Session *local_268;
  undefined1 local_260 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  char local_240 [16];
  _Alloc_hider local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  undefined1 local_210 [16];
  _Alloc_hider local_200;
  undefined1 local_1f8 [16];
  string local_1e8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  Message local_188;
  
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  local_26c = field;
  local_268 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_290,&MsgType_BusinessMessageReject,0x1d0c40);
  local_260._0_8_ = &PTR__FieldBase_001f8470;
  local_260._8_4_ = 0x23;
  pcVar1 = local_260 + 0x20;
  local_250._M_allocated_capacity = (size_type)pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_260 + 0x10),local_290._M_dataplus._M_p,
             local_290._M_dataplus._M_p + local_290._M_string_length);
  pcVar2 = local_260 + 0x40;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_210._0_4_ = 0;
  local_210._4_4_ = 0;
  local_260._0_8_ = &PTR__FieldBase_001f9500;
  local_230._M_p = pcVar2;
  newMessage(&local_188,local_268,(MsgType *)local_260);
  FieldBase::~FieldBase((FieldBase *)local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  this_01 = FieldMap::getFieldRef(&(message->m_header).super_FieldMap,0x22);
  if ((local_268->m_sessionID).m_isFIXT == true) {
    local_260._0_8_ = &PTR__FieldBase_001f8470;
    local_260._8_4_ = 0x471;
    pcVar4 = (local_268->m_senderDefaultApplVerID)._M_dataplus._M_p;
    local_250._M_allocated_capacity = (size_type)pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_260 + 0x10),pcVar4,
               pcVar4 + (local_268->m_senderDefaultApplVerID)._M_string_length);
    local_228 = 0;
    local_220._M_local_buf[0] = '\0';
    local_210._0_4_ = 0;
    local_210._4_4_ = 0;
    local_260._0_8_ = &PTR__FieldBase_001fa028;
    local_230._M_p = pcVar2;
    FieldMap::setField(&local_188.super_FieldMap,(FieldBase *)local_260,true);
    FieldBase::~FieldBase((FieldBase *)local_260);
  }
  fill(local_268,&local_188.m_header);
  pFVar6 = FieldMap::getFieldRef(&(message->m_header).super_FieldMap,0x23);
  psVar3 = (string *)(local_260 + 0x10);
  local_260._0_8_ = &PTR__FieldBase_001f8470;
  local_260._8_4_ = 0x174;
  pcVar4 = (pFVar6->m_string)._M_dataplus._M_p;
  local_250._M_allocated_capacity = (size_type)pcVar1;
  std::__cxx11::string::_M_construct<char*>
            (psVar3,pcVar4,pcVar4 + (pFVar6->m_string)._M_string_length);
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_210._0_4_ = 0;
  local_210._4_4_ = 0;
  local_260._0_8_ = &PTR__FieldBase_001fa0d0;
  local_230._M_p = pcVar2;
  FieldMap::setField(&local_188.super_FieldMap,(FieldBase *)local_260,true);
  FieldBase::~FieldBase((FieldBase *)local_260);
  data = UInt64Field::getValue((UInt64Field *)this_01);
  UInt64Field::UInt64Field((UInt64Field *)local_260,0x2d,data);
  local_260._0_8_ = &PTR__FieldBase_001fa098;
  FieldMap::setField(&local_188.super_FieldMap,(FieldBase *)local_260,true);
  FieldBase::~FieldBase((FieldBase *)local_260);
  IntField::IntField((IntField *)local_260,0x17c,err);
  local_260._0_8_ = &PTR__FieldBase_001fa178;
  FieldMap::setField(&local_188.super_FieldMap,(FieldBase *)local_260,true);
  FieldBase::~FieldBase((FieldBase *)local_260);
  this_00 = &local_268->m_state;
  SessionState::incrNextTargetMsgSeqNum(this_00);
  switch(err) {
  case 0:
    __s = "Other";
    break;
  case 1:
    __s = "Unknown ID";
    break;
  case 2:
    __s = "Unknown Security";
    break;
  case 3:
    __s = "Unsupported Message Type";
    break;
  case 4:
    __s = "Application Not Available";
    break;
  case 5:
    __s = "Conditionally Required Field Missing";
    break;
  case 6:
    __s = "Not Authorized";
    break;
  case 7:
    __s = "Deliver to firm not available at this time";
    break;
  default:
    bVar5 = false;
    __s = (char *)0x0;
    goto LAB_001ad3dc;
  }
  bVar5 = true;
LAB_001ad3dc:
  if (bVar5 && local_26c != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_260,__s,(allocator<char> *)&local_290);
    populateRejectReason(local_268,&local_188,local_26c,(string *)local_260);
    if ((string *)local_260._0_8_ != psVar3) {
      operator_delete((void *)local_260._0_8_,(ulong)(local_250._M_allocated_capacity + 1));
    }
    std::operator+(&local_1a8,"Message ",&this_01->m_string);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar9) {
      local_1b8._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_1b8._8_8_ = plVar7[3];
      local_1c8._M_p = (pointer)&local_1b8;
    }
    else {
      local_1b8._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_1c8._M_p = (pointer)*plVar7;
    }
    local_1c0 = plVar7[1];
    *plVar7 = (long)paVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    puVar10 = (ulong *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_1f8._0_8_ = *puVar10;
      local_1f8._8_8_ = plVar7[3];
      local_210._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1f8;
    }
    else {
      local_1f8._0_8_ = *puVar10;
      local_210._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar7;
    }
    local_200._M_p = (pointer)plVar7[1];
    *plVar7 = (long)puVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_210 + 8);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    puVar10 = (ulong *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_290.field_2._M_allocated_capacity = *puVar10;
      local_290.field_2._8_8_ = plVar7[3];
    }
    else {
      local_290.field_2._M_allocated_capacity = *puVar10;
      local_290._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_290._M_string_length = plVar7[1];
    *plVar7 = (long)puVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    IntTConvertor<unsigned_long>::convert_abi_cxx11_
              (&local_1e8,(IntTConvertor<unsigned_long> *)(long)local_26c,local_290._M_string_length
              );
    uVar12 = (_func_int **)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      uVar12 = local_290.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < (_func_int **)(local_1e8._M_string_length + local_290._M_string_length)) {
      uVar12 = (_func_int **)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        uVar12 = local_1e8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < (_func_int **)(local_1e8._M_string_length + local_290._M_string_length))
      goto LAB_001ad6ce;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_1e8,0,(char *)0x0,(ulong)local_290._M_dataplus._M_p);
    }
    else {
LAB_001ad6ce:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_1e8._M_dataplus._M_p)
      ;
    }
    psVar11 = (string *)(puVar8 + 2);
    if ((string *)*puVar8 == psVar11) {
      local_250._M_allocated_capacity = *(undefined8 *)psVar11;
      local_250._8_8_ = puVar8[3];
      local_260._0_8_ = psVar3;
    }
    else {
      local_250._M_allocated_capacity = *(undefined8 *)psVar11;
      local_260._0_8_ = (string *)*puVar8;
    }
    local_260._8_8_ = puVar8[1];
    *puVar8 = psVar11;
    puVar8[1] = 0;
    *psVar11 = (string)0x0;
    SessionState::onEvent(this_00,(string *)local_260);
    if ((string *)local_260._0_8_ != psVar3) {
      operator_delete((void *)local_260._0_8_,(ulong)(local_250._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8) {
      operator_delete((void *)local_210._8_8_,local_1f8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_p != &local_1b8) {
      operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) goto LAB_001ad91f;
  }
  else if (bVar5) {
    this_02 = (Session *)local_260;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_02,__s,(allocator<char> *)&local_290);
    populateRejectReason(this_02,&local_188,(string *)local_260);
    if ((string *)local_260._0_8_ != psVar3) {
      operator_delete((void *)local_260._0_8_,(ulong)(local_250._M_allocated_capacity + 1));
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_210 + 8),"Message ",&this_01->m_string);
    plVar7 = (long *)std::__cxx11::string::append(local_210 + 8);
    puVar10 = (ulong *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_290.field_2._M_allocated_capacity = *puVar10;
      local_290.field_2._8_8_ = plVar7[3];
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    }
    else {
      local_290.field_2._M_allocated_capacity = *puVar10;
      local_290._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_290._M_string_length = plVar7[1];
    *plVar7 = (long)puVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
    psVar11 = (string *)(puVar8 + 2);
    if ((string *)*puVar8 == psVar11) {
      local_250._M_allocated_capacity = *(undefined8 *)psVar11;
      local_250._8_8_ = puVar8[3];
      local_260._0_8_ = psVar3;
    }
    else {
      local_250._M_allocated_capacity = *(undefined8 *)psVar11;
      local_260._0_8_ = (string *)*puVar8;
    }
    local_260._8_8_ = puVar8[1];
    *puVar8 = psVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    SessionState::onEvent(this_00,(string *)local_260);
    if ((string *)local_260._0_8_ != psVar3) {
      operator_delete((void *)local_260._0_8_,(ulong)(local_250._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    local_1a8.field_2._M_allocated_capacity = local_1f8._0_8_;
    local_1a8._M_dataplus._M_p = (pointer)local_210._8_8_;
    if ((undefined1 *)local_210._8_8_ == local_1f8) goto LAB_001ad91f;
  }
  else {
    std::operator+(&local_290,"Message ",&this_01->m_string);
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
    psVar11 = (string *)(puVar8 + 2);
    if ((string *)*puVar8 == psVar11) {
      local_250._M_allocated_capacity = *(undefined8 *)psVar11;
      local_250._8_8_ = puVar8[3];
      local_260._0_8_ = psVar3;
    }
    else {
      local_250._M_allocated_capacity = *(undefined8 *)psVar11;
      local_260._0_8_ = (string *)*puVar8;
    }
    local_260._8_8_ = puVar8[1];
    *puVar8 = psVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    SessionState::onEvent(this_00,(string *)local_260);
    if ((string *)local_260._0_8_ != psVar3) {
      operator_delete((void *)local_260._0_8_,(ulong)(local_250._M_allocated_capacity + 1));
    }
    local_1a8.field_2._M_allocated_capacity = local_290.field_2._M_allocated_capacity;
    local_1a8._M_dataplus._M_p = local_290._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p == &local_290.field_2) goto LAB_001ad91f;
  }
  operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
LAB_001ad91f:
  sendRaw(local_268,&local_188,0);
  Message::~Message(&local_188);
  return;
}

Assistant:

void Session::generateBusinessReject(const Message &message, int err, int field) {
  Message reject = newMessage(MsgType(MsgType_BusinessMessageReject));
  auto const &msgSeqNum = message.getHeader().getField<MsgSeqNum>();

  if (m_sessionID.isFIXT()) {
    reject.setField(DefaultApplVerID(m_senderDefaultApplVerID));
  }
  fill(reject.getHeader());
  reject.setField(RefMsgType(message.getHeader().getField<MsgType>()));
  reject.setField(RefSeqNum(msgSeqNum));
  reject.setField(BusinessRejectReason(err));
  m_state.incrNextTargetMsgSeqNum();

  const char *reason = 0;
  switch (err) {
  case BusinessRejectReason_OTHER:
    reason = BusinessRejectReason_OTHER_TEXT;
    break;
  case BusinessRejectReason_UNKNOWN_ID:
    reason = BusinessRejectReason_UNKNOWN_ID_TEXT;
    break;
  case BusinessRejectReason_UNKNOWN_SECURITY:
    reason = BusinessRejectReason_UNKNOWN_SECURITY_TEXT;
    break;
  case BusinessRejectReason_UNSUPPORTED_MESSAGE_TYPE:
    reason = BusinessRejectReason_UNSUPPORTED_MESSAGE_TYPE_TEXT;
    break;
  case BusinessRejectReason_APPLICATION_NOT_AVAILABLE:
    reason = BusinessRejectReason_APPLICATION_NOT_AVAILABLE_TEXT;
    break;
  case BusinessRejectReason_CONDITIONALLY_REQUIRED_FIELD_MISSING:
    reason = BusinessRejectReason_CONDITIONALLY_REQUIRED_FIELD_MISSING_TEXT;
    break;
  case BusinessRejectReason_NOT_AUTHORIZED:
    reason = BusinessRejectReason_NOT_AUTHORIZED_TEXT;
    break;
  case BusinessRejectReason_DELIVER_TO_FIRM_NOT_AVAILABLE_AT_THIS_TIME:
    reason = BusinessRejectReason_DELIVER_TO_FIRM_NOT_AVAILABLE_AT_THIS_TIME_TEXT;
    break;
  };

  if (reason && field) {
    populateRejectReason(reject, field, reason);
    m_state.onEvent(
        "Message " + msgSeqNum.getString() + " Rejected: " + reason + ":" + SEQNUM_CONVERTOR::convert(field));
  } else if (reason) {
    populateRejectReason(reject, reason);
    m_state.onEvent("Message " + msgSeqNum.getString() + " Rejected: " + reason);
  } else {
    m_state.onEvent("Message " + msgSeqNum.getString() + " Rejected");
  }

  sendRaw(reject);
}